

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O1

ostream * tcu::Format::operator<<
                    (ostream *str,
                    Array<__gnu_cxx::__normal_iterator<const_vk::VkPresentModeKHR_*,_std::vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>_>_>
                    *fmt)

{
  VkPresentModeKHR *pVVar1;
  Enum<vk::VkPresentModeKHR,_4UL> local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>(str,"{ ",2);
  pVVar1 = (fmt->begin)._M_current;
  if ((fmt->end)._M_current != pVVar1) {
    do {
      if (pVVar1 != (fmt->begin)._M_current) {
        std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
      }
      local_40.m_value = *pVVar1;
      local_40.m_getName = ::vk::getPresentModeKHRName;
      Enum<vk::VkPresentModeKHR,_4UL>::toStream(&local_40,str);
      pVVar1 = pVVar1 + 1;
    } while (pVVar1 != (fmt->end)._M_current);
  }
  std::__ostream_insert<char,std::char_traits<char>>(str," }",2);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}